

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpParser.h
# Opt level: O3

void * __thiscall
uWS::HttpParser::consumePostPadded
          (HttpParser *this,char *data,int length,void *user,
          unique_function<void_*(void_*,_HttpRequest_*)> *requestHandler,
          unique_function<void_*(void_*,_std::string_view,_bool)> *dataHandler,
          unique_function<void_*(void_*)> *errorHandler)

{
  size_type sVar1;
  int iVar2;
  void *pvVar3;
  uint uVar4;
  function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_*(void_*,_std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_>
  *parent;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  basic_string_view<char,_std::char_traits<char>_> bVar6;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  basic_string_view<char,_std::char_traits<char>_> bVar8;
  pair<int,_void_*> pVar9;
  HttpRequest req;
  HttpRequest local_6c8;
  
  memset(&local_6c8,0,0x640);
  local_6c8.currentParameters.second = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
  local_6c8.bf.filter.super__Base_bitset<8UL>._M_w[0] = 0;
  local_6c8.bf.filter.super__Base_bitset<8UL>._M_w[1] = 0;
  local_6c8.bf.filter.super__Base_bitset<8UL>._M_w[2] = 0;
  local_6c8.bf.filter.super__Base_bitset<8UL>._M_w[3] = 0;
  local_6c8.bf.filter.super__Base_bitset<8UL>._M_w[4] = 0;
  local_6c8.bf.filter.super__Base_bitset<8UL>._M_w[5] = 0;
  local_6c8.bf.filter.super__Base_bitset<8UL>._M_w[6] = 0;
  local_6c8.bf.filter.super__Base_bitset<8UL>._M_w[7] = 0;
  local_6c8.currentParameters.first = 0;
  uVar4 = this->remainingStreamingBytes;
  bVar5._M_len = (ulong)uVar4;
  if (bVar5._M_len == 0) {
    sVar1 = (this->fallback)._M_string_length;
    if (sVar1 != 0) {
      std::__cxx11::string::reserve((ulong)this);
      std::__cxx11::string::append((char *)this,(ulong)data);
      pVar9 = fenceAndConsumePostPadded<1>
                        (this,(this->fallback)._M_dataplus._M_p,
                         (int)(this->fallback)._M_string_length,user,&local_6c8,requestHandler,
                         dataHandler);
      if (pVar9.second != user) {
        return pVar9.second;
      }
      if (pVar9.first == 0) {
        if ((this->fallback)._M_string_length != this->MAX_FALLBACK_SIZE) {
          return user;
        }
        goto LAB_0013f567;
      }
      (this->fallback)._M_string_length = 0;
      *(this->fallback)._M_dataplus._M_p = '\0';
      iVar2 = pVar9.first - (int)sVar1;
      data = data + iVar2;
      length = length - iVar2;
      uVar4 = this->remainingStreamingBytes;
      bVar6._M_len = (ulong)uVar4;
      if (bVar6._M_len != 0) {
        if ((uint)length <= uVar4) {
          bVar8._M_str = data;
          bVar8._M_len = (long)length;
          pvVar3 = (*(dataHandler->erasure_).vtable_.vtable_)
                             ((data_accessor *)dataHandler,0x10,user,bVar8,uVar4 == length);
          this->remainingStreamingBytes = this->remainingStreamingBytes - length;
          return pvVar3;
        }
        bVar6._M_str = data;
        pvVar3 = (*(dataHandler->erasure_).vtable_.vtable_)
                           ((data_accessor *)dataHandler,0x10,user,bVar6,true);
        uVar4 = this->remainingStreamingBytes;
        this->remainingStreamingBytes = 0;
        if (pvVar3 != user) {
          return pvVar3;
        }
        data = data + uVar4;
        length = length - uVar4;
      }
    }
  }
  else {
    if ((uint)length <= uVar4) {
      bVar7._M_str = data;
      bVar7._M_len = (long)length;
      pvVar3 = (*(dataHandler->erasure_).vtable_.vtable_)
                         ((data_accessor *)dataHandler,0x10,user,bVar7,uVar4 == length);
      this->remainingStreamingBytes = this->remainingStreamingBytes - length;
      return pvVar3;
    }
    bVar5._M_str = data;
    pvVar3 = (*(dataHandler->erasure_).vtable_.vtable_)
                       ((data_accessor *)dataHandler,0x10,user,bVar5,true);
    uVar4 = this->remainingStreamingBytes;
    this->remainingStreamingBytes = 0;
    if (pvVar3 != user) {
      return pvVar3;
    }
    data = data + uVar4;
    length = length - uVar4;
  }
  pVar9 = fenceAndConsumePostPadded<0>(this,data,length,user,&local_6c8,requestHandler,dataHandler);
  if (pVar9.second != user) {
    return pVar9.second;
  }
  uVar4 = length - pVar9.first;
  if (uVar4 == 0) {
    return user;
  }
  if ((ulong)uVar4 < this->MAX_FALLBACK_SIZE) {
    std::__cxx11::string::append((char *)this,(ulong)(data + pVar9.first));
    return user;
  }
LAB_0013f567:
  pvVar3 = (*(errorHandler->erasure_).vtable_.vtable_)((data_accessor *)errorHandler,0x10,user);
  return pvVar3;
}

Assistant:

void *consumePostPadded(char *data, int length, void *user, fu2::unique_function<void *(void *, HttpRequest *)> &&requestHandler, fu2::unique_function<void *(void *, std::string_view, bool)> &&dataHandler, fu2::unique_function<void *(void *)> &&errorHandler) {

        HttpRequest req;

        if (remainingStreamingBytes) {

            // this is exactly the same as below!
            // todo: refactor this
            if (remainingStreamingBytes >= (unsigned int) length) {
                void *returnedUser = dataHandler(user, std::string_view(data, length), remainingStreamingBytes == (unsigned int) length);
                remainingStreamingBytes -= length;
                return returnedUser;
            } else {
                void *returnedUser = dataHandler(user, std::string_view(data, remainingStreamingBytes), true);

                data += remainingStreamingBytes;
                length -= remainingStreamingBytes;

                remainingStreamingBytes = 0;

                if (returnedUser != user) {
                    return returnedUser;
                }
            }

        } else if (fallback.length()) {
            int had = (int) fallback.length();

            int maxCopyDistance = (int) std::min(MAX_FALLBACK_SIZE - fallback.length(), (size_t) length);

            /* We don't want fallback to be short string optimized, since we want to move it */
            fallback.reserve(fallback.length() + maxCopyDistance + std::max<int>(MINIMUM_HTTP_POST_PADDING, sizeof(std::string)));
            fallback.append(data, maxCopyDistance);

            // break here on break
            std::pair<int, void *> consumed = fenceAndConsumePostPadded<true>(fallback.data(), (int) fallback.length(), user, &req, requestHandler, dataHandler);
            if (consumed.second != user) {
                return consumed.second;
            }

            if (consumed.first) {

                fallback.clear();

                data += consumed.first - had;
                length -= consumed.first - had;

                if (remainingStreamingBytes) {
                    // this is exactly the same as above!
                    if (remainingStreamingBytes >= (unsigned int) length) {
                        void *returnedUser = dataHandler(user, std::string_view(data, length), remainingStreamingBytes == (unsigned int) length);
                        remainingStreamingBytes -= length;
                        return returnedUser;
                    } else {
                        void *returnedUser = dataHandler(user, std::string_view(data, remainingStreamingBytes), true);

                        data += remainingStreamingBytes;
                        length -= remainingStreamingBytes;

                        remainingStreamingBytes = 0;

                        if (returnedUser != user) {
                            return returnedUser;
                        }
                    }
                }

            } else {
                if (fallback.length() == MAX_FALLBACK_SIZE) {
                    // note: you don't really need error handler, just return something strange!
                    // we could have it return a constant pointer to denote error!
                    return errorHandler(user);
                }
                return user;
            }
        }

        std::pair<int, void *> consumed = fenceAndConsumePostPadded<false>(data, length, user, &req, requestHandler, dataHandler);
        if (consumed.second != user) {
            return consumed.second;
        }

        data += consumed.first;
        length -= consumed.first;

        if (length) {
            if ((unsigned int) length < MAX_FALLBACK_SIZE) {
                fallback.append(data, length);
            } else {
                return errorHandler(user);
            }
        }

        // added for now
        return user;
    }